

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::assert_empty(tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *this)

{
  AssertionResult *this_00;
  __atomic_base<unsigned_long> _Var1;
  char *message;
  char *in_R9;
  bool bVar2;
  undefined1 auStack_68 [8];
  AssertionResult gtest_ar;
  __atomic_base<unsigned_long> local_38;
  AssertionResult gtest_ar_;
  AssertHelper local_20;
  
  this_00 = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  bVar2 = (this->test_db).root.value._M_i.tagged_ptr == 0;
  local_38._M_i._0_1_ = bVar2;
  if (bVar2) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    local_38._M_i = (this->test_db).current_memory_use.super___atomic_base<unsigned_long>._M_i;
    local_20.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)auStack_68,"(test_db.get_current_memory_use())","(0)",&local_38._M_i,
               (int *)&local_20);
    if (auStack_68[0] != (string)0x0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      auStack_68 = (undefined1  [8])0x0;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      assert_node_counts(this,(node_type_counter_array *)auStack_68);
      return;
    }
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2ae,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
    this_00 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    _Var1._M_i = local_38._M_i;
  }
  else {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_68,(internal *)&local_38,(AssertionResult *)"test_db.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2ab,(char *)auStack_68);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)auStack_68);
    _Var1._M_i = (__int_type)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_);
  }
  if ((long *)_Var1._M_i != (long *)0x0) {
    (**(code **)(*(long *)_Var1._M_i + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  return;
}

Assistant:

void assert_empty() const {
    UNODB_ASSERT_TRUE(test_db.empty());

#ifdef UNODB_DETAIL_WITH_STATS
    UNODB_ASSERT_EQ(test_db.get_current_memory_use(), 0);

    assert_node_counts({0, 0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
  }